

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestCase *
vkt::createFunctionCaseWithPrograms<unsigned_int>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,uint arg0)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x88);
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,type,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00d00c50;
  this[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)initPrograms;
  this[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)testFunction;
  *(uint *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = arg0;
  return this;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}